

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTest::DeathTest(DeathTest *this)

{
  UnitTestImpl *this_00;
  undefined8 *in_RDI;
  TestInfo *info;
  string *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [32];
  TestInfo *local_10;
  
  *in_RDI = &PTR__DeathTest_001924e8;
  this_00 = GetUnitTestImpl();
  local_10 = UnitTestImpl::current_test_info(this_00);
  if (local_10 == (TestInfo *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"Cannot run a death test outside of a TEST or TEST_F construct",&local_31);
    DeathTestAbort(in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

DeathTest::DeathTest() {
  TestInfo* const info = GetUnitTestImpl()->current_test_info();
  if (info == nullptr) {
    DeathTestAbort("Cannot run a death test outside of a TEST or "
                   "TEST_F construct");
  }
}